

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

int xml_print_list(lyout *out,int level,lyd_node *node,int is_list,int toplevel,int options)

{
  ly_ctx *ctx;
  int iVar1;
  int *piVar2;
  lys_module *plVar3;
  char *pcVar4;
  uint local_84;
  int local_74;
  uint local_64;
  uint local_54;
  char *ns;
  lyd_node *child;
  int options_local;
  int toplevel_local;
  int is_list_local;
  lyd_node *node_local;
  int level_local;
  lyout *out_local;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  if (is_list == 0) {
    xml_print_leaf(out,level,node,toplevel,options);
  }
  else {
    if (((toplevel == 0) && (node->parent != (lyd_node *)0x0)) &&
       (iVar1 = nscmp(node,node->parent), iVar1 == 0)) {
      if (level == 0) {
        local_64 = 0;
      }
      else {
        local_64 = level * 2 - 2;
      }
      ly_print(out,"%*s<%s",(ulong)local_64,"",node->schema->name);
    }
    else {
      plVar3 = lyd_node_module(node);
      if (level == 0) {
        local_54 = 0;
      }
      else {
        local_54 = level * 2 - 2;
      }
      ly_print(out,"%*s<%s xmlns=\"%s\"",(ulong)local_54,"",node->schema->name,plVar3->ns);
    }
    if (toplevel != 0) {
      xml_print_ns(out,node,options);
    }
    iVar1 = xml_print_attrs(out,node,options);
    if (iVar1 != 0) {
      return 1;
    }
    if (node->child == (lyd_node *)0x0) {
      pcVar4 = "";
      if (level != 0) {
        pcVar4 = "\n";
      }
      ly_print(out,"/>%s",pcVar4);
    }
    else {
      pcVar4 = "";
      if (level != 0) {
        pcVar4 = "\n";
      }
      ly_print(out,">%s",pcVar4);
      for (ns = (char *)node->child; ns != (char *)0x0; ns = *(char **)(ns + 0x18)) {
        if (level == 0) {
          local_74 = 0;
        }
        else {
          local_74 = level + 1;
        }
        iVar1 = xml_print_node(out,local_74,(lyd_node *)ns,0,options);
        if (iVar1 != 0) {
          return 1;
        }
      }
      if (level == 0) {
        local_84 = 0;
      }
      else {
        local_84 = level * 2 - 2;
      }
      pcVar4 = "";
      if (level != 0) {
        pcVar4 = "\n";
      }
      ly_print(out,"%*s</%s>%s",(ulong)local_84,"",node->schema->name,pcVar4);
    }
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (iVar1 != 0) {
    ctx = node->schema->module->ctx;
    piVar2 = __errno_location();
    pcVar4 = strerror(*piVar2);
    ly_log(ctx,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar4);
  }
  out_local._4_4_ = (uint)(iVar1 != 0);
  return out_local._4_4_;
}

Assistant:

static int
xml_print_list(struct lyout *out, int level, const struct lyd_node *node, int is_list, int toplevel, int options)
{
    struct lyd_node *child;
    const char *ns;

    LY_PRINT_SET;

    if (is_list) {
        /* list print */
        if (toplevel || !node->parent || nscmp(node, node->parent)) {
            /* print "namespace" */
            ns = lyd_node_module(node)->ns;
            ly_print(out, "%*s<%s xmlns=\"%s\"", LEVEL, INDENT, node->schema->name, ns);
        } else {
            ly_print(out, "%*s<%s", LEVEL, INDENT, node->schema->name);
        }

        if (toplevel) {
            xml_print_ns(out, node, options);
        }
        if (xml_print_attrs(out, node, options)) {
            return EXIT_FAILURE;
        }

        if (!node->child) {
            ly_print(out, "/>%s", level ? "\n" : "");
            goto finish;
        }
        ly_print(out, ">%s", level ? "\n" : "");

        LY_TREE_FOR(node->child, child) {
            if (xml_print_node(out, level ? level + 1 : 0, child, 0, options)) {
                return EXIT_FAILURE;
            }
        }

        ly_print(out, "%*s</%s>%s", LEVEL, INDENT, node->schema->name, level ? "\n" : "");
    } else {
        /* leaf-list print */
        xml_print_leaf(out, level, node, toplevel, options);
    }

finish:
    LY_PRINT_RET(node->schema->module->ctx);
}